

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O1

void * toggle_new(t_symbol *s,int argc,t_atom *argv)

{
  t_iem_fstyle_flags tVar1;
  bool bVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  t_iemgui *iemgui;
  _glist *p_Var7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  t_float tVar11;
  float fVar12;
  float fVar13;
  int local_84;
  t_iemgui_drawfunctions local_68;
  
  iemgui = iemgui_new(toggle_class);
  p_Var7 = canvas_getcurrent();
  iVar6 = 0;
  iVar4 = sys_zoomfontheight(p_Var7->gl_font,1,0);
  p_Var7 = canvas_getcurrent();
  iVar5 = sys_zoomfontheight(p_Var7->gl_font,1,0);
  iVar10 = iemgui->x_fontsize;
  local_68.draw_new = toggle_draw_new;
  local_68.draw_config = toggle_draw_config;
  local_68.draw_iolets = (t_iemfunptr)0x0;
  local_68.draw_update = toggle_draw_update;
  local_68.draw_select = toggle_draw_select;
  local_68.draw_erase = (t_iemdrawfunptr)0x0;
  local_68.draw_move = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions(iemgui,&local_68);
  if ((((((argc - 0xdU < 2) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
       ((argv[2].a_type - A_FLOAT < 2 && (argv[3].a_type - A_FLOAT < 2)))) &&
      ((argv[4].a_type - A_FLOAT < 2 && ((argv[5].a_type == A_FLOAT && (argv[6].a_type == A_FLOAT)))
       ))) && ((argv[7].a_type == A_FLOAT &&
               ((argv[8].a_type == A_FLOAT && (argv[0xc].a_type == A_FLOAT)))))) {
    tVar11 = atom_getfloatarg(0,argc,argv);
    iVar4 = (int)tVar11;
    tVar11 = atom_getfloatarg(1,argc,argv);
    iem_inttosymargs(&iemgui->x_isa,(int)tVar11);
    iemgui_new_getnames(iemgui,2,argv);
    tVar11 = atom_getfloatarg(5,argc,argv);
    iVar6 = (int)tVar11;
    tVar11 = atom_getfloatarg(6,argc,argv);
    local_84 = (int)tVar11;
    tVar11 = atom_getfloatarg(7,argc,argv);
    iem_inttofstyle(&iemgui->x_fsf,(int)tVar11);
    tVar11 = atom_getfloatarg(8,argc,argv);
    iVar10 = (int)tVar11;
    iemgui_all_loadcolors(iemgui,argv + 9,argv + 10,argv + 0xb);
    tVar11 = atom_getfloatarg(0xc,argc,argv);
    bVar2 = tVar11 != 0.0;
  }
  else {
    iVar4 = iVar4 + 5;
    local_84 = (int)((double)(iVar5 * -8 + -0x28) / 15.0);
    iemgui_new_getnames(iemgui,2,(t_atom *)0x0);
    bVar2 = false;
  }
  dVar3 = 1.0;
  if ((argc == 0xe) && (dVar3 = 1.0, argv[0xd].a_type == A_FLOAT)) {
    tVar11 = atom_getfloatarg(0xd,0xe,argv);
    dVar3 = (double)tVar11;
  }
  tVar1 = iemgui->x_fsf;
  uVar8 = (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7;
  uVar9 = (uint)(iemgui->x_rcv != (t_symbol *)0x0) << 6;
  iemgui->x_fsf = (t_iem_fstyle_flags)(uVar9 | (uint)tVar1 & 0xffffff3f | uVar8);
  if (((uint)tVar1 & 0x3f) == 2) {
    builtin_strncpy(iemgui->x_font,"times",6);
  }
  else if (((uint)tVar1 & 0x3f) == 1) {
    builtin_strncpy(iemgui->x_font,"helvetica",10);
  }
  else {
    iemgui->x_fsf = (t_iem_fstyle_flags)(uVar9 | (uint)tVar1 & 0xffffff00 | uVar8);
    strcpy(iemgui->x_font,sys_font);
  }
  *(float *)((long)&iemgui[1].x_obj.te_g.g_pd + 4) =
       (float)(double)(~-(ulong)(dVar3 != 0.0) & 0x3ff0000000000000 |
                      -(ulong)(dVar3 != 0.0) & (ulong)dVar3);
  if (bVar2) {
    fVar13 = (float)dVar3;
  }
  else {
    fVar13 = 0.0;
  }
  fVar12 = 0.0;
  if (((uint)iemgui->x_isa & 1) != 0) {
    fVar12 = fVar13;
  }
  *(float *)&iemgui[1].x_obj.te_g.g_pd = fVar12;
  if (((uint)iemgui->x_fsf & 0x40) != 0) {
    pd_bind((t_pd *)iemgui,iemgui->x_rcv);
  }
  iemgui->x_ldx = iVar6;
  iemgui->x_ldy = local_84;
  iVar6 = 4;
  if (4 < iVar10) {
    iVar6 = iVar10;
  }
  iemgui->x_fontsize = iVar6;
  iVar10 = iemgui_clip_size(iVar4);
  iemgui->x_w = iVar10;
  iemgui->x_h = iVar10;
  iemgui_verify_snd_ne_rcv(iemgui);
  iemgui_newzoom(iemgui);
  outlet_new(&iemgui->x_obj,&s_float);
  return iemgui;
}

Assistant:

static void *toggle_new(t_symbol *s, int argc, t_atom *argv)
{
    t_toggle *x = (t_toggle *)iemgui_new(toggle_class);
    int a = IEM_GUI_DEFAULTSIZE, f = 0;
    int ldx = 0, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE;
    int fs = x->x_gui.x_fontsize;
    t_float on = 0.0, nonzero = 1.0;
    char str[144];

    IEMGUI_SETDRAWFUNCTIONS(x, toggle);

    if(((argc == 13)||(argc == 14))&&IS_A_FLOAT(argv,0)
       &&IS_A_FLOAT(argv,1)
       &&(IS_A_SYMBOL(argv,2)||IS_A_FLOAT(argv,2))
       &&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3))
       &&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4))
       &&IS_A_FLOAT(argv,5)&&IS_A_FLOAT(argv,6)
       &&IS_A_FLOAT(argv,7)&&IS_A_FLOAT(argv,8)&&IS_A_FLOAT(argv,12))
    {
        a = (int)atom_getfloatarg(0, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(1, argc, argv));
        iemgui_new_getnames(&x->x_gui, 2, argv);
        ldx = (int)atom_getfloatarg(5, argc, argv);
        ldy = (int)atom_getfloatarg(6, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(7, argc, argv));
        fs = (int)atom_getfloatarg(8, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+9, argv+10, argv+11);
        on = (t_float)atom_getfloatarg(12, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 2, 0);
    if((argc == 14)&&IS_A_FLOAT(argv,13))
        nonzero = (t_float)atom_getfloatarg(13, argc, argv);

    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    x->x_nonzero = (nonzero != 0.0) ? nonzero : 1.0;
    if(x->x_gui.x_isa.x_loadinit)
        x->x_on = (on != 0.0) ? nonzero : 0.0;
    else
        x->x_on = 0.0;
    if (x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_gui.x_w = iemgui_clip_size(a);
    x->x_gui.x_h = x->x_gui.x_w;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    outlet_new(&x->x_gui.x_obj, &s_float);
    return (x);
}